

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O3

void __thiscall
alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::resize
          (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
           *this,double target_density,bool force_retrain,bool keep_left,bool keep_right)

{
  int iVar1;
  ulong *puVar2;
  uint64_t *puVar3;
  int *piVar4;
  int *piVar5;
  int iVar6;
  uint uVar7;
  unsigned_long *__s;
  int *piVar8;
  int *piVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  ulong __n;
  size_type __n_00;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  uint64_t uVar16;
  int iVar17;
  uint uVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  uint uVar23;
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  longdouble lVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined8 in_XMM3_Qa;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined8 in_XMM8_Qb;
  int local_fc;
  LinearModelBuilder<int> local_a8;
  
  iVar17 = this->num_keys_;
  if (iVar17 == 0) {
    return;
  }
  iVar6 = iVar17 + 1;
  if (iVar17 + 1 <= (int)((double)iVar17 / target_density)) {
    iVar6 = (int)((double)iVar17 / target_density);
  }
  uVar22 = 0;
  dVar31 = (double)iVar6;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = dVar31 * 0.015625;
  auVar34 = vroundsd_avx(auVar34,auVar34,10);
  __n = vcvttsd2usi_avx512f(auVar34);
  __s = __gnu_cxx::new_allocator<unsigned_long>::allocate
                  ((new_allocator<unsigned_long> *)&local_a8,__n,(void *)0x0);
  memset(__s,0,-(ulong)(__n >> 0x3d != 0) | __n * 8);
  __n_00 = (size_type)iVar6;
  piVar8 = __gnu_cxx::new_allocator<int>::allocate
                     ((new_allocator<int> *)&local_a8,__n_00,(void *)0x0);
  piVar9 = __gnu_cxx::new_allocator<int>::allocate
                     ((new_allocator<int> *)&local_a8,__n_00,(void *)0x0);
  local_fc = this->num_keys_;
  if (local_fc < 0x32 || force_retrain) {
    puVar2 = this->bitmap_;
    uVar11 = *puVar2;
    if (uVar11 == 0) {
      uVar22 = 1;
      if (1 < this->bitmap_size_) {
        uVar22 = (ulong)(uint)this->bitmap_size_;
      }
      uVar10 = 0;
      uVar14 = 0;
      do {
        if (uVar22 - 1 == uVar14) {
          uVar18 = 0xffffffff;
          goto LAB_0013b007;
        }
        uVar11 = puVar2[uVar14 + 1];
        uVar14 = uVar14 + 1;
      } while (uVar11 == 0);
      uVar22 = uVar14 & 0xffffffff;
    }
    uVar18 = 0;
    for (uVar10 = uVar11; (uVar10 & 1) == 0; uVar10 = uVar10 >> 1 | 0x8000000000000000) {
      uVar18 = uVar18 + 1;
    }
    uVar18 = uVar18 | (int)uVar22 << 6;
    uVar10 = uVar11 - 1 & uVar11;
LAB_0013b007:
    local_a8.model_ = &(this->super_AlexNode<int,_int>).model_;
    local_a8.count_ = 0;
    local_a8.xy_sum_ = (longdouble)0;
    local_a8.x_min_ = 0x7fffffff;
    local_a8.x_max_ = -0x80000000;
    local_a8.y_min_ = 1.79769313486232e+308;
    local_a8.y_max_ = -1.79769313486232e+308;
    local_a8.x_sum_ = local_a8.xy_sum_;
    local_a8.y_sum_ = local_a8.xy_sum_;
    local_a8.xx_sum_ = local_a8.xy_sum_;
    if (uVar18 != 0xffffffff && (int)uVar18 < this->data_capacity_) {
      auVar34 = ZEXT816(0xffefffffffffffff);
      auVar36 = ZEXT816(0x7fefffffffffffff);
      local_a8.x_max_ = -0x80000000;
      local_a8.x_min_ = 0x7fffffff;
      iVar17 = 0;
      do {
        auVar38._0_8_ = (double)iVar17;
        auVar38._8_8_ = in_XMM3_Qa;
        iVar1 = this->key_slots_[(int)uVar18];
        local_a8.count_ = iVar17 + 1;
        auVar36 = vminsd_avx(auVar36,auVar38);
        auVar34 = vmaxsd_avx(auVar34,auVar38);
        lVar30 = (longdouble)iVar1;
        local_a8.x_sum_ = local_a8.x_sum_ + lVar30;
        if (iVar1 <= local_a8.x_min_) {
          local_a8.x_min_ = iVar1;
        }
        if (iVar1 < local_a8.x_max_) {
          iVar1 = local_a8.x_max_;
        }
        local_a8.x_max_ = iVar1;
        local_a8.y_sum_ = local_a8.y_sum_ + (longdouble)iVar17;
        local_a8.xx_sum_ = lVar30 * lVar30 + local_a8.xx_sum_;
        local_a8.xy_sum_ = (longdouble)iVar17 * lVar30 + local_a8.xy_sum_;
        if (uVar10 == 0) {
          lVar19 = (long)(int)uVar22;
          do {
            lVar19 = lVar19 + 1;
            if (this->bitmap_size_ <= lVar19) goto LAB_0013b146;
            uVar10 = puVar2[lVar19];
            uVar22 = (ulong)((int)uVar22 + 1);
          } while (uVar10 == 0);
        }
        uVar18 = 0;
        for (uVar11 = uVar10; (uVar11 & 1) == 0; uVar11 = uVar11 >> 1 | 0x8000000000000000) {
          uVar18 = uVar18 + 1;
        }
        uVar18 = uVar18 | (int)uVar22 << 6;
      } while ((uVar18 != 0xffffffff) &&
              (uVar10 = uVar10 - 1 & uVar10, iVar17 = local_a8.count_,
              (int)uVar18 < this->data_capacity_));
LAB_0013b146:
      local_a8.y_min_ = auVar36._0_8_;
      local_a8.y_max_ = auVar34._0_8_;
    }
    LinearModelBuilder<int>::build(&local_a8);
    if (keep_left) {
      local_fc = this->num_keys_;
      dVar32 = (double)this->data_capacity_ / (double)local_fc;
      dVar33 = (this->super_AlexNode<int,_int>).model_.b_;
      (this->super_AlexNode<int,_int>).model_.a_ =
           dVar32 * (this->super_AlexNode<int,_int>).model_.a_;
      (this->super_AlexNode<int,_int>).model_.b_ = dVar32 * dVar33;
    }
    else if (keep_right) {
      iVar17 = this->data_capacity_;
      local_fc = this->num_keys_;
      dVar33 = (double)iVar17 / (double)local_fc;
      (this->super_AlexNode<int,_int>).model_.a_ =
           dVar33 * (this->super_AlexNode<int,_int>).model_.a_;
      (this->super_AlexNode<int,_int>).model_.b_ =
           dVar33 * (this->super_AlexNode<int,_int>).model_.b_ + (double)(iVar6 - iVar17);
    }
    else {
      local_fc = this->num_keys_;
      dVar33 = (this->super_AlexNode<int,_int>).model_.b_;
      (this->super_AlexNode<int,_int>).model_.a_ =
           (dVar31 / (double)local_fc) * (this->super_AlexNode<int,_int>).model_.a_;
      (this->super_AlexNode<int,_int>).model_.b_ = (dVar31 / (double)local_fc) * dVar33;
    }
  }
  else if (keep_right) {
    (this->super_AlexNode<int,_int>).model_.b_ =
         (double)(iVar6 - this->data_capacity_) + (this->super_AlexNode<int,_int>).model_.b_;
  }
  else if (!keep_left) {
    dVar32 = dVar31 / (double)this->data_capacity_;
    dVar33 = (this->super_AlexNode<int,_int>).model_.b_;
    (this->super_AlexNode<int,_int>).model_.a_ = dVar32 * (this->super_AlexNode<int,_int>).model_.a_
    ;
    (this->super_AlexNode<int,_int>).model_.b_ = dVar32 * dVar33;
  }
  auVar29 = _DAT_0014db80;
  puVar3 = this->bitmap_;
  uVar22 = 0;
  uVar11 = 0;
  uVar16 = *puVar3;
  if (uVar16 == 0) {
    uVar10 = 1;
    if (1 < this->bitmap_size_) {
      uVar10 = (ulong)(uint)this->bitmap_size_;
    }
    uVar22 = 0;
    do {
      if (uVar10 - 1 == uVar22) {
        uVar11 = 0;
        goto LAB_0013b453;
      }
      uVar16 = puVar3[uVar22 + 1];
      uVar22 = uVar22 + 1;
    } while (uVar16 == 0);
  }
  uVar18 = 0;
  for (uVar10 = uVar16; (uVar10 & 1) == 0; uVar10 = uVar10 >> 1 | 0x8000000000000000) {
    uVar18 = uVar18 + 1;
  }
  uVar18 = uVar18 | (int)uVar22 << 6;
  if ((uVar18 != 0xffffffff) && ((int)uVar18 < this->data_capacity_)) {
    auVar36._8_8_ = 0;
    auVar36._0_8_ = (this->super_AlexNode<int,_int>).model_.a_;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = (this->super_AlexNode<int,_int>).model_.b_;
    auVar24 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    uVar16 = uVar16 - 1 & uVar16;
    piVar4 = this->key_slots_;
    piVar5 = this->payload_slots_;
    iVar17 = iVar6 - local_fc;
    lVar19 = __n_00 - (long)local_fc;
    uVar23 = 0xffffffff;
    do {
      uVar13 = uVar23 + 1;
      iVar1 = piVar4[(int)uVar18];
      auVar41._0_8_ = (double)iVar1;
      auVar41._8_8_ = in_XMM8_Qb;
      auVar34 = vfmadd213sd_fma(auVar41,auVar36,auVar40);
      uVar12 = (uint)auVar34._0_8_;
      uVar7 = uVar12;
      if ((int)uVar12 < (int)uVar13) {
        uVar7 = uVar13;
      }
      uVar11 = (ulong)uVar7;
      if ((int)(iVar6 - uVar7) < local_fc) {
        uVar11 = (ulong)(uint)(iVar6 - local_fc);
        if ((int)uVar13 < iVar6 - local_fc) {
          lVar15 = (long)(int)uVar23;
          auVar25 = vpbroadcastd_avx512f();
          lVar20 = lVar15 + 2;
          if (lVar15 + 2 < lVar19) {
            lVar20 = lVar19;
          }
          uVar10 = 0;
          auVar26 = vpbroadcastq_avx512f();
          do {
            auVar27 = vpbroadcastq_avx512f();
            auVar28 = vporq_avx512f(auVar27,auVar29);
            auVar27 = vporq_avx512f(auVar27,auVar24);
            vpcmpuq_avx512f(auVar27,auVar26,2);
            vpcmpuq_avx512f(auVar28,auVar26,2);
            auVar27 = vmovdqu32_avx512f(auVar25);
            *(undefined1 (*) [64])(piVar8 + lVar15 + uVar10 + 1) = auVar27;
            uVar10 = uVar10 + 0x10;
          } while (((lVar20 - lVar15) + 0xeU & 0xfffffffffffffff0) != uVar10);
        }
        if (0 < local_fc) {
          uVar11 = (ulong)iVar17;
          do {
            piVar8[uVar11] = piVar4[(int)uVar18];
            piVar9[uVar11] = piVar5[(int)uVar18];
            __s[(int)uVar11 >> 6] = __s[(int)uVar11 >> 6] | 1L << (uVar11 & 0x3f);
            if (uVar16 == 0) {
              uVar14 = (ulong)this->bitmap_size_;
              uVar21 = (long)(int)uVar22 + 1;
              uVar10 = uVar14;
              if ((long)uVar14 < (long)uVar21) {
                uVar10 = uVar21;
              }
              do {
                if ((long)uVar14 <= (long)uVar21) {
                  uVar18 = 0xffffffff;
                  uVar22 = uVar10 & 0xffffffff;
                  uVar16 = 0;
                  goto LAB_0013b6ba;
                }
                uVar16 = puVar3[uVar21];
                uVar22 = (ulong)((int)uVar22 + 1);
                uVar21 = uVar21 + 1;
              } while (uVar16 == 0);
            }
            uVar18 = 0;
            for (uVar10 = uVar16; (uVar10 & 1) == 0; uVar10 = uVar10 >> 1 | 0x8000000000000000) {
              uVar18 = uVar18 + 1;
            }
            uVar16 = uVar16 - 1 & uVar16;
            uVar18 = uVar18 | (int)uVar22 << 6;
LAB_0013b6ba:
            uVar11 = uVar11 + 1;
          } while ((long)uVar11 < (long)__n_00);
        }
        goto LAB_0013b453;
      }
      if ((int)uVar13 < (int)uVar12) {
        auVar25 = vpbroadcastd_avx512f();
        auVar26 = vpbroadcastq_avx512f();
        uVar10 = 0;
        do {
          auVar27 = vpbroadcastq_avx512f();
          auVar28 = vporq_avx512f(auVar27,auVar29);
          auVar27 = vporq_avx512f(auVar27,auVar24);
          vpcmpuq_avx512f(auVar27,auVar26,2);
          vpcmpuq_avx512f(auVar28,auVar26,2);
          auVar27 = vmovdqu32_avx512f(auVar25);
          *(undefined1 (*) [64])(piVar8 + (long)(int)uVar23 + uVar10 + 1) = auVar27;
          uVar10 = uVar10 + 0x10;
        } while (((ulong)((uVar7 - uVar23) - 2) + 0x10 & 0xfffffffffffffff0) != uVar10);
      }
      piVar8[uVar11] = iVar1;
      piVar9[uVar11] = piVar5[(int)uVar18];
      __s[uVar7 >> 6] = __s[uVar7 >> 6] | 1L << (uVar11 & 0x3f);
      if (uVar16 == 0) {
        lVar20 = (long)(int)uVar22;
        do {
          lVar20 = lVar20 + 1;
          if (this->bitmap_size_ <= lVar20) goto LAB_0013b3c4;
          uVar16 = puVar3[lVar20];
          uVar22 = (ulong)((int)uVar22 + 1);
        } while (uVar16 == 0);
      }
      uVar18 = 0;
      for (uVar11 = uVar16; (uVar11 & 1) == 0; uVar11 = uVar11 >> 1 | 0x8000000000000000) {
        uVar18 = uVar18 + 1;
      }
      uVar18 = uVar18 | (int)uVar22 << 6;
      if (uVar18 == 0xffffffff) break;
      local_fc = local_fc + -1;
      uVar16 = uVar16 - 1 & uVar16;
      iVar17 = iVar17 + 1;
      lVar19 = lVar19 + 1;
      uVar23 = uVar7;
    } while ((int)uVar18 < this->data_capacity_);
LAB_0013b3c4:
    uVar11 = (ulong)(uVar7 + 1);
  }
LAB_0013b453:
  iVar17 = (int)uVar11;
  if (iVar17 < iVar6) {
    auVar29 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar24 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar25 = vpbroadcastd_avx512f(ZEXT416(0x7fffffff));
    uVar22 = 0;
    auVar26 = vpbroadcastq_avx512f();
    do {
      auVar27 = vpbroadcastq_avx512f();
      auVar28 = vporq_avx512f(auVar27,auVar29);
      auVar27 = vporq_avx512f(auVar27,auVar24);
      vpcmpuq_avx512f(auVar27,auVar26,2);
      vpcmpuq_avx512f(auVar28,auVar26,2);
      auVar27 = vmovdqu32_avx512f(auVar25);
      *(undefined1 (*) [64])(piVar8 + (long)iVar17 + uVar22) = auVar27;
      uVar22 = uVar22 + 0x10;
    } while (((__n_00 - (long)iVar17) + 0xf & 0xfffffffffffffff0) != uVar22);
  }
  operator_delete(this->key_slots_,(long)this->data_capacity_ << 2);
  operator_delete(this->payload_slots_,(long)this->data_capacity_ << 2);
  operator_delete(this->bitmap_,(long)this->bitmap_size_ << 3);
  this->data_capacity_ = iVar6;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = dVar31;
  this->bitmap_size_ = (int)__n;
  this->key_slots_ = piVar8;
  this->payload_slots_ = piVar9;
  this->bitmap_ = __s;
  auVar35._0_8_ = (double)(this->num_keys_ + 1);
  auVar35._8_8_ = in_XMM8_Qb;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = dVar31 * 0.8;
  auVar34 = vmaxsd_avx(auVar35,auVar37);
  auVar34 = vminsd_avx(auVar39,auVar34);
  this->expansion_threshold_ = auVar34._0_8_;
  this->contraction_threshold_ = dVar31 * 0.6;
  return;
}

Assistant:

void resize(double target_density, bool force_retrain = false,
              bool keep_left = false, bool keep_right = false) {
    if (num_keys_ == 0) {
      return;
    }

    int new_data_capacity =
        std::max(static_cast<int>(num_keys_ / target_density), num_keys_ + 1);
    auto new_bitmap_size =
        static_cast<size_t>(std::ceil(new_data_capacity / 64.));
    auto new_bitmap = new (bitmap_allocator().allocate(new_bitmap_size))
        uint64_t[new_bitmap_size]();  // initialize to all false
#if ALEX_DATA_NODE_SEP_ARRAYS
    T* new_key_slots =
        new (key_allocator().allocate(new_data_capacity)) T[new_data_capacity];
    P* new_payload_slots = new (payload_allocator().allocate(new_data_capacity))
        P[new_data_capacity];
#else
    V* new_data_slots = new (value_allocator().allocate(new_data_capacity))
        V[new_data_capacity];
#endif

    // Retrain model if the number of keys is sufficiently small (under 50)
    if (num_keys_ < 50 || force_retrain) {
      const_iterator_type it(this, 0);
      LinearModelBuilder<T> builder(&(this->model_));
      for (int i = 0; it.cur_idx_ < data_capacity_ && !it.is_end(); it++, i++) {
        builder.add(it.key(), i);
      }
      builder.build();
      if (keep_left) {
        this->model_.expand(static_cast<double>(data_capacity_) / num_keys_);
      } else if (keep_right) {
        this->model_.expand(static_cast<double>(data_capacity_) / num_keys_);
        this->model_.b_ += (new_data_capacity - data_capacity_);
      } else {
        this->model_.expand(static_cast<double>(new_data_capacity) / num_keys_);
      }
    } else {
      if (keep_right) {
        this->model_.b_ += (new_data_capacity - data_capacity_);
      } else if (!keep_left) {
        this->model_.expand(static_cast<double>(new_data_capacity) /
                            data_capacity_);
      }
    }

    int last_position = -1;
    int keys_remaining = num_keys_;
    const_iterator_type it(this, 0);
    for (; it.cur_idx_ < data_capacity_ && !it.is_end(); it++) {
      int position = this->model_.predict(it.key());
      position = std::max<int>(position, last_position + 1);

      int positions_remaining = new_data_capacity - position;
      if (positions_remaining < keys_remaining) {
        // fill the rest of the store contiguously
        int pos = new_data_capacity - keys_remaining;
        for (int j = last_position + 1; j < pos; j++) {
#if ALEX_DATA_NODE_SEP_ARRAYS
          new_key_slots[j] = it.key();
#else
          new_data_slots[j].first = it.key();
#endif
        }
        for (; pos < new_data_capacity; pos++, it++) {
#if ALEX_DATA_NODE_SEP_ARRAYS
          new_key_slots[pos] = it.key();
          new_payload_slots[pos] = it.payload();
#else
          new_data_slots[pos] = *it;
#endif
          set_bit(new_bitmap, pos);
        }
        last_position = pos - 1;
        break;
      }

      for (int j = last_position + 1; j < position; j++) {
#if ALEX_DATA_NODE_SEP_ARRAYS
        new_key_slots[j] = it.key();
#else
        new_data_slots[j].first = it.key();
#endif
      }

#if ALEX_DATA_NODE_SEP_ARRAYS
      new_key_slots[position] = it.key();
      new_payload_slots[position] = it.payload();
#else
      new_data_slots[position] = *it;
#endif
      set_bit(new_bitmap, position);

      last_position = position;

      keys_remaining--;
    }

    for (int i = last_position + 1; i < new_data_capacity; i++) {
#if ALEX_DATA_NODE_SEP_ARRAYS
      new_key_slots[i] = kEndSentinel_;
#else
      new_data_slots[i].first = kEndSentinel;
#endif
    }

#if ALEX_DATA_NODE_SEP_ARRAYS
    key_allocator().deallocate(key_slots_, data_capacity_);
    payload_allocator().deallocate(payload_slots_, data_capacity_);
#else
    value_allocator().deallocate(data_slots_, data_capacity_);
#endif
    bitmap_allocator().deallocate(bitmap_, bitmap_size_);

    data_capacity_ = new_data_capacity;
    bitmap_size_ = new_bitmap_size;
#if ALEX_DATA_NODE_SEP_ARRAYS
    key_slots_ = new_key_slots;
    payload_slots_ = new_payload_slots;
#else
    data_slots_ = new_data_slots;
#endif
    bitmap_ = new_bitmap;

    expansion_threshold_ =
        std::min(std::max(data_capacity_ * kMaxDensity_,
                          static_cast<double>(num_keys_ + 1)),
                 static_cast<double>(data_capacity_));
    contraction_threshold_ = data_capacity_ * kMinDensity_;
  }